

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool ON_Font::EqualWeight(ON_Font *lhs,ON_Font *rhs,bool bUnsetIsEqual)

{
  if (rhs != (ON_Font *)0x0 && lhs != (ON_Font *)0x0) {
    if ((lhs->m_font_weight == rhs->m_font_weight) ||
       ((bUnsetIsEqual && (lhs->m_font_weight == Unset || rhs->m_font_weight == Unset)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Font::EqualWeight(
  const ON_Font* lhs,
  const ON_Font* rhs,
  bool bUnsetIsEqual
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs->m_font_weight != rhs->m_font_weight)
  {
    if (false == bUnsetIsEqual)
      return false;
    if (ON_Font::Weight::Unset != lhs->m_font_weight && ON_Font::Weight::Unset != rhs->m_font_weight)
      return false;
  }
  return true;
}